

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::CheckQuestRules(Character *this)

{
  bool bVar1;
  Quest *this_00;
  _Base_ptr p_Var2;
  pair<const_short,_std::shared_ptr<Quest_Context>_> q;
  pair<const_short,_std::shared_ptr<Quest_Context>_> pStack_38;
  
  for (p_Var2 = (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->quests)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
              (&pStack_38,(pair<const_short,_std::shared_ptr<Quest_Context>_> *)(p_Var2 + 1));
    if (pStack_38.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (Quest_Context *)0x0) {
      this_00 = Quest_Context::GetQuest
                          (pStack_38.second.
                           super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar1 = Quest::Disabled(this_00);
      if (!bVar1) {
        EOPlus::Context::CheckRules
                  (&(pStack_38.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_Context);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pStack_38.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void Character::CheckQuestRules()
{
	UTIL_FOREACH(this->quests, q)
	{
		if (!q.second || q.second->GetQuest()->Disabled())
			continue;

		q.second->CheckRules();
	}
}